

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

Command * __thiscall VkSpecParser::parseCommand(Command *__return_storage_ptr__,VkSpecParser *this)

{
  Data *pDVar1;
  QString *pQVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  iterator iVar6;
  iterator iVar7;
  pointer pTVar8;
  QXmlStreamAttribute *attr;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  undefined1 auVar10 [16];
  Data *local_1a0;
  Data *local_188;
  QString *local_180;
  QArrayDataPointer<char16_t> local_170;
  QArrayDataPointer<char16_t> local_158;
  undefined1 local_140 [8];
  char16_t *pcStack_138;
  Data *local_130;
  QArrayDataPointer<QString> local_128;
  QArrayDataPointer<char16_t> local_108;
  Command local_e8;
  TypedName local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8._96_8_ = 0xaaaaaaaaaaaaaaaa;
  local_e8.cmd.name.d.d = (Data *)0x0;
  local_e8.cmd.name.d.ptr = (char16_t *)0x0;
  local_e8.cmd.name.d.size = 0;
  local_e8.cmd.type.d.d = (Data *)0x0;
  local_e8.cmd.type.d.ptr = (char16_t *)0x0;
  local_e8.cmd.type.d.size = 0;
  local_e8.cmd.typeSuffix.d.d = (Data *)0x0;
  local_e8.cmd.typeSuffix.d.ptr = (char16_t *)0x0;
  local_e8.cmd.typeSuffix.d.size = 0;
  local_e8.args.d.d = (Data *)0x0;
  local_e8.args.d.ptr = (TypedName *)0x0;
  local_e8.args.d.size = 0;
  local_108.d = (Data *)0x0;
  local_108.ptr = (char16_t *)0x0;
  local_108.size = 0;
  QXmlStreamReader::attributes();
  iVar6 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_80);
  iVar7 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_80);
  local_1a0 = (Data *)0x0;
  local_180 = (QString *)0x0;
  local_188 = (Data *)0x0;
  while( true ) {
    if (iVar6.i == iVar7.i) break;
    local_158.ptr = ((iVar6.i)->m_name).m_string.ptr;
    local_158.d = (Data *)((iVar6.i)->m_name).m_string.size;
    local_128.d = (Data *)0x0;
    local_140 = (undefined1  [8])0x0;
    pcStack_138 = (char16_t *)0x0;
    local_130 = (Data *)0x0;
    local_128.ptr = (QString *)0x10a0e8;
    local_170.ptr = L"api";
    local_170.d = (Data *)0x3;
    local_128.size = (qsizetype)(Data *)0x3;
    bVar4 = comparesEqual((QStringView *)&local_158,(QStringView *)&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
    if (bVar4) {
      local_158.ptr = ((iVar6.i)->m_value).m_string.ptr;
      local_158.d = (Data *)((iVar6.i)->m_value).m_string.size;
      QStringView::toString((QString *)local_140,(QStringView *)&local_158);
      QString::trimmed_helper((QString *)&local_128);
      qVar3 = local_128.size;
      pQVar2 = local_128.ptr;
      pDVar1 = local_128.d;
      local_108.d = (Data *)local_128.d;
      local_128.d = local_188;
      local_108.ptr = (char16_t *)local_128.ptr;
      local_128.ptr = local_180;
      local_108.size = local_128.size;
      local_128.size = (qsizetype)local_1a0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
      local_1a0 = (Data *)qVar3;
      local_180 = pQVar2;
      local_188 = pDVar1;
    }
    iVar6.i = iVar6.i + 1;
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_80);
  if (local_1a0 != (Data *)0x0) {
    QString::split(&local_80,&local_108,0x2c,0,1);
    local_128.d = (Data *)0x0;
    local_140 = (undefined1  [8])0x0;
    pcStack_138 = (char16_t *)0x0;
    local_128.ptr = (QString *)0x10a0fa;
    local_130 = (Data *)0x0;
    local_128.size = 6;
    bVar4 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)&local_80,(QString *)&local_128,CaseSensitive
                      );
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_80);
    if (!bVar4) {
      skip(this);
      (__return_storage_ptr__->args).d.ptr = (TypedName *)0x0;
      (__return_storage_ptr__->args).d.size = 0;
      (__return_storage_ptr__->cmd).typeSuffix.d.size = 0;
      (__return_storage_ptr__->args).d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).typeSuffix.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->cmd).type.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->cmd).type.d.size = 0;
      (__return_storage_ptr__->cmd).name.d.size = 0;
      (__return_storage_ptr__->cmd).type.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).name.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).name.d.ptr = (char16_t *)0x0;
      __return_storage_ptr__->deviceLevel = false;
      goto LAB_00103db2;
    }
  }
  while( true ) {
    cVar5 = QXmlStreamReader::atEnd();
    if (cVar5 != '\0') break;
    QXmlStreamReader::readNext();
    bVar4 = QXmlStreamReader::isEndElement(&this->m_reader);
    if (bVar4) {
      auVar10 = QXmlStreamReader::name();
      local_80.name.d.d = (Data *)0x0;
      local_128.d = (Data *)0x0;
      local_128.ptr = (QString *)0x0;
      local_128.size = 0;
      local_80.name.d.ptr = L"command";
      local_80.name.d.size = 7;
      local_158.d = (Data *)0x7;
      local_158.ptr = L"command";
      _local_140 = auVar10;
      bVar4 = comparesEqual((QStringView *)local_140,(QStringView *)&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
      if (bVar4) break;
    }
    bVar4 = QXmlStreamReader::isStartElement(&this->m_reader);
    if (bVar4) {
      local_80.name.d.d = (Data *)0x0;
      local_80.name.d.ptr = (char16_t *)0x0;
      local_128.d = (Data *)0x0;
      local_128.ptr = (QString *)0x10a128;
      local_80.name.d.size = 0;
      local_128.size = 5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
      local_80.name.d.d = (Data *)0x0;
      local_80.name.d.ptr = (char16_t *)0x0;
      local_140 = (undefined1  [8])0x0;
      pcStack_138 = L"param";
      local_80.name.d.size = 0;
      local_130 = (Data *)0x5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
      local_80.name.d._0_16_ = QXmlStreamReader::name();
      local_158.d = (Data *)local_128.size;
      local_158.ptr = (char16_t *)local_128.ptr;
      bVar4 = comparesEqual((QStringView *)&local_80,(QStringView *)&local_158);
      if (bVar4) {
        parseParamOrProto(&local_80,this,(QString *)&local_128);
        TypedName::operator=(&local_e8.cmd,&local_80);
LAB_00103bc9:
        TypedName::~TypedName(&local_80);
      }
      else {
        auVar10 = QXmlStreamReader::name();
        local_158.d = local_130;
        local_158.ptr = pcStack_138;
        local_80.name.d._0_16_ = auVar10;
        bVar4 = comparesEqual((QStringView *)&local_80,(QStringView *)&local_158);
        if (bVar4) {
          parseParamOrProto(&local_80,this,(QString *)local_140);
          QList<VkSpecParser::TypedName>::emplaceBack<VkSpecParser::TypedName>
                    (&local_e8.args,&local_80);
          goto LAB_00103bc9;
        }
        skip(this);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    }
  }
  local_e8._96_8_ = local_e8._96_8_ & 0xffffffffffffff00;
  if (local_e8.args.d.size != 0) {
    local_80.name.d.d = (Data *)0x0;
    local_80.name.d.ptr = L"VkDevice";
    local_80.name.d.size = 8;
    local_80.type.d.d = (Data *)0x0;
    local_80.type.d.ptr = L"VkQueue";
    local_128.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_128.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_140 = (undefined1  [8])0x0;
    pcStack_138 = (char16_t *)0x0;
    local_130 = (Data *)0x0;
    local_158.d = (Data *)0x0;
    local_158.ptr = (char16_t *)0x0;
    local_158.size = 0;
    local_80.type.d.size = 7;
    local_80.typeSuffix.d.d = (Data *)0x0;
    local_128.size = -0x5555555555555556;
    local_170.d = (Data *)0x0;
    local_170.ptr = (char16_t *)0x0;
    local_80.typeSuffix.d.ptr = L"VkCommandBuffer";
    local_170.size = 0;
    local_80.typeSuffix.d.size = 0xf;
    args._M_len = 3;
    args._M_array = &local_80.name;
    QList<QString>::QList((QList<QString> *)&local_128,args);
    lVar9 = 0x30;
    do {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)((long)&local_80.name.d.d + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
    pTVar8 = QList<VkSpecParser::TypedName>::data(&local_e8.args);
    bVar4 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)&local_128,&pTVar8->type,CaseSensitive);
    if (bVar4) {
      local_80.name.d.d = (Data *)0x0;
      local_140 = (undefined1  [8])0x0;
      pcStack_138 = (char16_t *)0x0;
      local_80.name.d.ptr = L"vkGetDeviceProcAddr";
      local_130 = (Data *)0x0;
      local_80.name.d.size = 0x13;
      bVar4 = operator!=((QString *)&local_e8,&local_80.name);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_140);
      if (bVar4) {
        local_e8.deviceLevel = true;
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  }
  Command::Command(__return_storage_ptr__,&local_e8);
LAB_00103db2:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  Command::~Command(&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::Command VkSpecParser::parseCommand()
{
    Command c;

    // <command successcodes="VK_SUCCESS" ...>
    //   <proto><type>VkResult</type> <name>vkCreateInstance</name></proto>
    //   <param>const <type>VkInstanceCreateInfo</type>* <name>pCreateInfo</name></param>
    //   <param optional="true">const <type>VkAllocationCallbacks</type>* <name>pAllocator</name></param>
    //   <param><type>VkInstance</type>* <name>pInstance</name></param>

    QString api;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
    }
    // skip commands with api="vulkansc", but the api attribute is optional
    if (!api.isEmpty() && !api.split(',').contains(QStringLiteral("vulkan"))) {
        skip();
        return {};
    }

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("command"))
            break;
        if (m_reader.isStartElement()) {
            const QString protoStr = QStringLiteral("proto");
            const QString paramStr = QStringLiteral("param");
            if (m_reader.name() == protoStr) {
                c.cmd = parseParamOrProto(protoStr);
            } else if (m_reader.name() == paramStr) {
                c.args.append(parseParamOrProto(paramStr));
            } else {
                skip();
            }
        }
    }

    c.deviceLevel = false;
    if (!c.args.isEmpty()) {
        QStringList dispatchableDeviceAndChildTypes {
            QStringLiteral("VkDevice"),
            QStringLiteral("VkQueue"),
            QStringLiteral("VkCommandBuffer")
        };
        if (dispatchableDeviceAndChildTypes.contains(c.args[0].type)
                && c.cmd.name != QStringLiteral("vkGetDeviceProcAddr"))
        {
            c.deviceLevel = true;
        }
    }

    return c;
}